

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

uint * __thiscall ON_Mesh::GetVertexLocationIds(ON_Mesh *this,uint first_vid,uint *Vid,uint *Vindex)

{
  bool bVar1;
  uint uVar2;
  ON_3dPoint *points;
  ON_3fPoint *points_00;
  uint *local_40;
  uint vertex_count;
  uint *Vindex_local;
  uint *Vid_local;
  uint first_vid_local;
  ON_Mesh *this_local;
  
  uVar2 = VertexUnsignedCount(this);
  bVar1 = HasSynchronizedDoubleAndSinglePrecisionVertices(this);
  if (bVar1) {
    points = ON_SimpleArray<ON_3dPoint>::Array(&(this->m_dV).super_ON_SimpleArray<ON_3dPoint>);
    local_40 = ON_GetPointLocationIds((ulong)uVar2,points,first_vid,Vid,Vindex);
  }
  else {
    points_00 = ON_SimpleArray<ON_3fPoint>::Array(&(this->m_V).super_ON_SimpleArray<ON_3fPoint>);
    local_40 = ON_GetPointLocationIds((ulong)uVar2,points_00,first_vid,Vid,Vindex);
  }
  return local_40;
}

Assistant:

unsigned int* ON_Mesh::GetVertexLocationIds(
  unsigned int first_vid,
  unsigned int* Vid,
  unsigned int* Vindex
  ) const
{
  const unsigned int vertex_count = VertexUnsignedCount();
  return (HasSynchronizedDoubleAndSinglePrecisionVertices())
    ? ON_GetPointLocationIds(vertex_count, m_dV.Array(), first_vid, Vid, Vindex)
    : ON_GetPointLocationIds(vertex_count, m_V.Array(), first_vid, Vid, Vindex);
}